

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O2

int av1_get_palette_color_index_context
              (uint8_t *color_map,int stride,int r,int c,int palette_size,uint8_t *color_order,
              int *color_idx)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int j;
  ulong uVar8;
  undefined8 local_a4;
  uint local_9c [8];
  int color_neighbors [3];
  int scores [18];
  int inverse_color_order [8];
  
  if (c < 1) {
    local_a4 = 0xffffffffffffffff;
    if (r < 1) goto LAB_003289d5;
    lVar2 = (long)((r + -1) * stride + c);
  }
  else {
    if (r < 1) {
      local_a4 = CONCAT44(0xffffffff,(uint)color_map[(long)(r * stride + c) + -1]);
LAB_003289d5:
      local_9c[0] = 0xffffffff;
      goto LAB_003289db;
    }
    lVar2 = (long)((r + -1) * stride + c);
    local_a4 = (ulong)CONCAT14(color_map[lVar2 + -1],(uint)color_map[(long)(r * stride + c) + -1]);
  }
  local_9c[0] = (uint)color_map[lVar2];
LAB_003289db:
  scores[2] = 0;
  scores[3] = 0;
  scores[4] = 0;
  scores[5] = 0;
  color_neighbors[1] = 0;
  color_neighbors[2] = 0;
  scores[0] = 0;
  scores[1] = 0;
  scores[6] = 0;
  scores[7] = 0;
  local_9c[5] = 0;
  local_9c[6] = 0;
  stack0xffffffffffffff80 = 0;
  local_9c[1] = 0;
  local_9c[2] = 0;
  local_9c[3] = 0;
  local_9c[4] = 0;
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    if (-1 < (long)*(int *)((long)&local_a4 + lVar2)) {
      local_9c[(long)*(int *)((long)&local_a4 + lVar2) + 1] =
           local_9c[(long)*(int *)((long)&local_a4 + lVar2) + 1] +
           *(int *)((long)av1_get_palette_color_index_context::weights + lVar2);
    }
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    color_order[lVar2] = (uint8_t)lVar2;
    scores[lVar2 + 10] = (int)lVar2;
  }
  uVar6 = 1;
  for (uVar7 = 0; uVar7 != 3; uVar7 = uVar7 + 1) {
    uVar5 = local_9c[uVar7 + 1];
    uVar4 = uVar7 & 0xffffffff;
    for (uVar8 = uVar6; (long)uVar8 < (long)palette_size; uVar8 = uVar8 + 1) {
      if ((int)uVar5 < (int)local_9c[uVar8 + 1]) {
        uVar4 = uVar8 & 0xffffffff;
        uVar5 = local_9c[uVar8 + 1];
      }
    }
    if (uVar7 != uVar4) {
      lVar2 = (long)(int)uVar4;
      uVar5 = local_9c[lVar2 + 1];
      bVar1 = color_order[lVar2];
      for (; (long)uVar7 < lVar2; lVar2 = lVar2 + -1) {
        local_9c[lVar2 + 1] = local_9c[lVar2];
        color_order[lVar2] = color_order[lVar2 + -1];
        scores[(ulong)color_order[lVar2 + -1] + 10] = (int)lVar2;
      }
      local_9c[uVar7 + 1] = uVar5;
      color_order[uVar7] = bVar1;
      scores[(ulong)bVar1 + 10] = (int)uVar7;
    }
    uVar6 = uVar6 + 1;
  }
  if (color_idx != (int *)0x0) {
    *color_idx = scores[(ulong)color_map[r * stride + c] + 10];
  }
  iVar3 = 0;
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    iVar3 = iVar3 + *(int *)((long)av1_get_palette_color_index_context::hash_multipliers + lVar2) *
                    *(int *)((long)local_9c + lVar2 + 4);
  }
  return av1_palette_color_index_context_lookup[iVar3];
}

Assistant:

int av1_get_palette_color_index_context(const uint8_t *color_map, int stride,
                                        int r, int c, int palette_size,
                                        uint8_t *color_order, int *color_idx) {
  assert(palette_size <= PALETTE_MAX_SIZE);
  assert(r > 0 || c > 0);

  // Get color indices of neighbors.
  int color_neighbors[NUM_PALETTE_NEIGHBORS];
  color_neighbors[0] = (c - 1 >= 0) ? color_map[r * stride + c - 1] : -1;
  color_neighbors[1] =
      (c - 1 >= 0 && r - 1 >= 0) ? color_map[(r - 1) * stride + c - 1] : -1;
  color_neighbors[2] = (r - 1 >= 0) ? color_map[(r - 1) * stride + c] : -1;

  // The +10 below should not be needed. But we get a warning "array subscript
  // is above array bounds [-Werror=array-bounds]" without it, possibly due to
  // this (or similar) bug: https://gcc.gnu.org/bugzilla/show_bug.cgi?id=59124
  int scores[PALETTE_MAX_SIZE + 10] = { 0 };
  int i;
  static const int weights[NUM_PALETTE_NEIGHBORS] = { 2, 1, 2 };
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    if (color_neighbors[i] >= 0) {
      scores[color_neighbors[i]] += weights[i];
    }
  }

  int inverse_color_order[PALETTE_MAX_SIZE];
  for (i = 0; i < PALETTE_MAX_SIZE; ++i) {
    color_order[i] = i;
    inverse_color_order[i] = i;
  }

  // Get the top NUM_PALETTE_NEIGHBORS scores (sorted from large to small).
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    int max = scores[i];
    int max_idx = i;
    for (int j = i + 1; j < palette_size; ++j) {
      if (scores[j] > max) {
        max = scores[j];
        max_idx = j;
      }
    }
    if (max_idx != i) {
      // Move the score at index 'max_idx' to index 'i', and shift the scores
      // from 'i' to 'max_idx - 1' by 1.
      const int max_score = scores[max_idx];
      const uint8_t max_color_order = color_order[max_idx];
      for (int k = max_idx; k > i; --k) {
        scores[k] = scores[k - 1];
        color_order[k] = color_order[k - 1];
        inverse_color_order[color_order[k]] = k;
      }
      scores[i] = max_score;
      color_order[i] = max_color_order;
      inverse_color_order[color_order[i]] = i;
    }
  }

  if (color_idx != NULL)
    *color_idx = inverse_color_order[color_map[r * stride + c]];

  // Get hash value of context.
  int color_index_ctx_hash = 0;
  static const int hash_multipliers[NUM_PALETTE_NEIGHBORS] = { 1, 2, 2 };
  for (i = 0; i < NUM_PALETTE_NEIGHBORS; ++i) {
    color_index_ctx_hash += scores[i] * hash_multipliers[i];
  }
  assert(color_index_ctx_hash > 0);
  assert(color_index_ctx_hash <= MAX_COLOR_CONTEXT_HASH);

  // Lookup context from hash.
  const int color_index_ctx =
      av1_palette_color_index_context_lookup[color_index_ctx_hash];
  assert(color_index_ctx >= 0);
  assert(color_index_ctx < PALETTE_COLOR_INDEX_CONTEXTS);
  return color_index_ctx;
}